

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.c
# Opt level: O2

void * thread_pool_thread(void *threadpool)

{
  sem_t *__sem;
  int iVar1;
  undefined8 *__ptr;
  undefined4 extraout_var;
  
  __sem = (sem_t *)((long)threadpool + 0x78);
  do {
    iVar1 = sem_wait((sem_t *)((long)threadpool + 0x58));
    if (iVar1 != 0) {
LAB_001014c0:
      exit(-4);
    }
    iVar1 = sem_wait(__sem);
    if (iVar1 != 0) goto LAB_001014c0;
    if (*(char *)((long)threadpool + 0x18) == '\x01') {
      iVar1 = getQueueSize(*(Queue **)((long)threadpool + 0x10));
      if (iVar1 == 0) {
        iVar1 = sem_post(__sem);
        if (iVar1 == 0) {
          return (void *)CONCAT44(extraout_var,iVar1);
        }
        goto LAB_001014c0;
      }
    }
    __ptr = (undefined8 *)dequeue(*(Queue **)((long)threadpool + 0x10));
    iVar1 = sem_post(__sem);
    if (iVar1 != 0) goto LAB_001014c0;
    (*(code *)*__ptr)(__ptr[1],__ptr[2]);
    free(__ptr);
  } while( true );
}

Assistant:

static void *thread_pool_thread(void *threadpool) {
   thread_pool_t *pool = (thread_pool_t*) threadpool;

   while(true){
       /* Waits for the task. */
       if(sem_wait(&(pool->runnables_semaphore))) {
           exit(semaphore_error);
       }

       /* Waits for permission to get the pool, when has task. */
       if(sem_wait(&(pool->pool_mutex))) {
           exit(semaphore_error);
       }

       /* Checks, if has to stop. */
       if(pool->end && getQueueSize(pool->runnables) == 0) {
           if(sem_post(&(pool->pool_mutex))){
               exit(semaphore_error);
           }
           break;
       }

       /* Deletes the task from queue. */
       runnable_t *task = dequeue(pool->runnables);

       /* Returns semaphore. */
       if(sem_post(&(pool->pool_mutex))) {
           exit(semaphore_error);
       }

       /* Run the task. */
       (*(task->function))(task->arg, task->argsz);

       free(task);
   }
}